

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O2

int main(int argc,char **argv)

{
  Result RVar1;
  StageResult SVar2;
  Emulator *e;
  int iVar3;
  Buffer rom;
  
  if (argc == 2) {
    RVar1 = read_file(argv[1],&rom);
    if (RVar1 == OK) {
      e = (Emulator *)calloc(1,0x800f8);
      (e->state).reg[0x15] = 0xf0;
      (e->rom).data = rom.data;
      (e->rom).size = rom.size;
      (e->state).pc = 0xe000480;
      (e->state).pipeline.if_.s.active = true;
      iVar3 = 0x16e361;
      do {
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) goto LAB_00105718;
        SVar2 = step(e);
      } while (SVar2 != STAGE_RESULT_UNIMPLEMENTED);
      e->verbosity = 2;
      step(e);
LAB_00105718:
      free(e);
      return 0;
    }
  }
  else {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]lupica/src/lupica.c",0x7b0);
    fwrite("no rom file given.\n",0x13,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  --argc; ++argv;
  int result = 1;
  CHECK_MSG(argc == 1, "no rom file given.\n");
  const char* rom_filename = argv[0];

  Buffer rom;
  CHECK(SUCCESS(read_file(rom_filename, &rom)));
  Emulator* e = malloc(sizeof(Emulator));
  init_emulator(e, &rom);

  e->verbosity = 0;

  StageResult sr;
  int i;
  for (i = 0; i < 1500000; ++i) {
    sr = step(e);

    if (sr == STAGE_RESULT_UNIMPLEMENTED) {
      e->verbosity = 2;
      step(e);
      break;
    }
  }

  free(e);

  return 0;
  ON_ERROR_RETURN;
}